

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_branch_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b519b::CpuBranchTest::branch_test
          (CpuBranchTest *this,uint8_t branch_flag,int8_t offset,uint8_t expected_cycles)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  MockSpec<unsigned_char_(unsigned_short)> *this_00;
  TypedExpectation<unsigned_char_(unsigned_short)> *this_01;
  char *message;
  AssertHelper local_b0;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_80;
  WithoutMatchers local_5d [13];
  Matcher<unsigned_short> local_50;
  MockSpec<unsigned_char_(unsigned_short)> local_38;
  uint8_t local_13;
  int8_t local_12;
  uint8_t local_11;
  uint8_t expected_cycles_local;
  int8_t offset_local;
  CpuBranchTest *pCStack_10;
  uint8_t branch_flag_local;
  CpuBranchTest *this_local;
  
  (this->super_CpuTest).registers.p = branch_flag;
  (this->super_CpuTest).expected.p = branch_flag;
  iVar4 = (this->super_CpuTest).registers.pc + 2;
  local_13 = expected_cycles;
  local_12 = offset;
  local_11 = branch_flag;
  pCStack_10 = this;
  if (SCARRY4(iVar4,(int)offset)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  (this->super_CpuTest).expected.pc = (short)iVar4 + (short)offset;
  uVar1 = (this->super_CpuTest).registers.pc;
  if (!SCARRY4((uint)uVar1,1)) {
    testing::Matcher<unsigned_short>::Matcher(&local_50,uVar1 + 1);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_38,&(this->super_CpuTest).mmu.super_MockMmu,&local_50);
    testing::internal::GetWithoutMatchers();
    this_00 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                        (&local_38,local_5d,(void *)0x0);
    this_01 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                        (this_00,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_branch_instructions.cpp"
                         ,0x14,"mmu","read_byte(registers.pc + 1)");
    testing::Return<signed_char>((testing *)&gtest_ar.message_,local_12);
    testing::internal::ReturnAction::operator_cast_to_Action
              (&local_80,(ReturnAction *)&gtest_ar.message_);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(this_01,&local_80)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_80);
    testing::internal::ReturnAction<signed_char>::~ReturnAction
              ((ReturnAction<signed_char> *)&gtest_ar.message_);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_38);
    testing::Matcher<unsigned_short>::~Matcher(&local_50);
    n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,local_13);
    testing::internal::EqHelper::
    Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
              ((EqHelper *)local_a0,"expected","registers",&(this->super_CpuTest).expected,
               &(this->super_CpuTest).registers);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar3) {
      testing::Message::Message(&local_a8);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_branch_instructions.cpp"
                 ,0x17,message);
      testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      testing::Message::~Message(&local_a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void branch_test(uint8_t branch_flag,
            int8_t offset,
            uint8_t expected_cycles) {
        expected.p = registers.p = branch_flag;
        expected.pc = registers.pc + static_cast<uint8_t>(2) + offset;

        EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(offset));

        step_execution(expected_cycles);
        EXPECT_EQ(expected, registers);
    }